

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O1

Pointer<anurbs::BrepEdge> __thiscall
anurbs::Ref<anurbs::BrepEdge>::data(Ref<anurbs::BrepEdge> *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  Pointer<anurbs::BrepEdge> PVar4;
  Pointer<anurbs::BrepEdge> PVar5;
  
  peVar1 = (this->m_entry).
           super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (peVar1->m_data).super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  (in_RDI->m_trims).
  super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var3._M_pi;
  p_Var2 = (peVar1->m_data).super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (in_RDI->m_trims).
  super__Vector_base<anurbs::Ref<anurbs::BrepTrim>,_std::allocator<anurbs::Ref<anurbs::BrepTrim>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      PVar4.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      PVar4.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (Pointer<anurbs::BrepEdge>)
             PVar4.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    UNLOCK();
  }
  PVar5.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar5.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Pointer<anurbs::BrepEdge>)
         PVar5.super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Pointer<TData> data() const
    {
        return m_entry->data();
    }